

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

char * deqp::gls::BufferTestUtil::getUsageHintName(deUint32 hint)

{
  char *pcStack_10;
  deUint32 hint_local;
  
  switch(hint) {
  case 0x88e0:
    pcStack_10 = "stream_draw";
    break;
  case 0x88e1:
    pcStack_10 = "stream_read";
    break;
  case 0x88e2:
    pcStack_10 = "stream_copy";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case 0x88e4:
    pcStack_10 = "static_draw";
    break;
  case 0x88e5:
    pcStack_10 = "static_read";
    break;
  case 0x88e6:
    pcStack_10 = "static_copy";
    break;
  case 0x88e8:
    pcStack_10 = "dynamic_draw";
    break;
  case 0x88e9:
    pcStack_10 = "dynamic_read";
    break;
  case 0x88ea:
    pcStack_10 = "dynamic_copy";
  }
  return pcStack_10;
}

Assistant:

const char* getUsageHintName (deUint32 hint)
{
	switch (hint)
	{
		case GL_STREAM_DRAW:	return "stream_draw";
		case GL_STREAM_READ:	return "stream_read";
		case GL_STREAM_COPY:	return "stream_copy";
		case GL_STATIC_DRAW:	return "static_draw";
		case GL_STATIC_READ:	return "static_read";
		case GL_STATIC_COPY:	return "static_copy";
		case GL_DYNAMIC_DRAW:	return "dynamic_draw";
		case GL_DYNAMIC_READ:	return "dynamic_read";
		case GL_DYNAMIC_COPY:	return "dynamic_copy";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}